

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

void __thiscall adios2::core::ADIOS::GlobalServices::CheckStatus(GlobalServices *this)

{
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if (this->wasGlobalShutdown == true) {
    std::__cxx11::string::string((string *)&local_28,"Core",&local_89);
    std::__cxx11::string::string((string *)&local_48,"ADIOS::GlobalServices",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"CheckStatus",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,
               "Global Services was already shutdown. Make sure there is one true global ADIOS object that is created first and destructed last to ensure Global services are initialized only once"
               ,&local_8c);
    helper::Throw<std::logic_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void CheckStatus()
    {
        if (wasGlobalShutdown)
        {
            helper::Throw<std::logic_error>(
                "Core", "ADIOS::GlobalServices", "CheckStatus",
                "Global Services was already shutdown. Make sure there is one "
                "true global ADIOS object that is created first and destructed "
                "last to ensure Global services are initialized only once");
        }
    }